

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

uint64_t enet_crc64(ENetBuffer *buffers,int bufferCount)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint8_t *puVar3;
  uint8_t *dataEnd;
  uint8_t *data;
  uint64_t crc;
  ENetBuffer *pEStack_10;
  int bufferCount_local;
  ENetBuffer *buffers_local;
  
  data = (uint8_t *)0xffffffffffffffff;
  crc._4_4_ = bufferCount;
  pEStack_10 = buffers;
  while (0 < crc._4_4_) {
    dataEnd = (uint8_t *)pEStack_10->data;
    puVar3 = dataEnd + pEStack_10->dataLength;
    for (; dataEnd < puVar3; dataEnd = dataEnd + 1) {
      data = (uint8_t *)((ulong)data >> 8 ^ crcTable[(int)((uint)data & 0xff ^ (uint)*dataEnd)]);
    }
    pEStack_10 = pEStack_10 + 1;
    crc._4_4_ = crc._4_4_ + -1;
  }
  uVar1 = htonl((uint)data ^ 0xffffffff);
  uVar2 = htonl((uint)((ulong)data >> 0x20) ^ 0xffffffff);
  return CONCAT44(uVar1,uVar2);
}

Assistant:

uint64_t enet_crc64(const ENetBuffer* buffers, int bufferCount) {
	uint64_t crc = 0xFFFFFFFFFFFFFFFF;

	while (bufferCount-- > 0) {
		const uint8_t* data = (const uint8_t*)buffers->data;
		const uint8_t* dataEnd = &data[buffers->dataLength];

		while (data < dataEnd) {
			crc = (crc >> 8) ^ crcTable[(uint8_t)crc ^ *data++];
		}

		++buffers;
	}

	return ENET_HOST_TO_NET_64(~crc);
}